

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

void __thiscall
HashTable<ObjTypeGuardBucket,Memory::ArenaAllocator>::
Or<ObjTypeGuardBucket(*)(ObjTypeGuardBucket,ObjTypeGuardBucket)>
          (HashTable<ObjTypeGuardBucket,Memory::ArenaAllocator> *this,
          HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this2,
          _func_ObjTypeGuardBucket_ObjTypeGuardBucket_ObjTypeGuardBucket *fn)

{
  int iVar1;
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  JITTypeHolder JVar3;
  code *pcVar4;
  ObjTypeGuardBucket OVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  NodeBase *pNVar9;
  Type *pTVar10;
  Type *pTVar11;
  Type *pTVar12;
  ulong uVar13;
  bool bVar14;
  ObjTypeGuardBucket OVar15;
  JITTypeHolderBase<void> local_98;
  BVSparse<Memory::JitArenaAllocator> *local_90;
  JITTypeHolder local_88;
  BVSparse<Memory::JitArenaAllocator> *local_80;
  ulong local_78;
  HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *local_70;
  undefined1 local_68 [8];
  EditingIterator iter;
  undefined1 local_40 [8];
  Iterator iter2;
  
  if (*(int *)(this + 8) != 0) {
    local_70 = this2;
    pNVar9 = (NodeBase *)__tls_get_addr(&PTR_0155fe48);
    uVar13 = 0;
    iter.last = pNVar9;
    do {
      local_40 = (undefined1  [8])(local_70->table + uVar13);
      iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   local_40;
      if (local_40 == (undefined1  [8])0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)&pNVar9->next = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) {
LAB_003f25b8:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *(undefined4 *)&pNVar9->next = 0;
      }
      pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])pSVar2 != local_40) {
        iter2.list = pSVar2;
      }
      local_68 = (undefined1  [8])(uVar13 * 0x10 + *(long *)(this + 0x10));
      iter.super_Iterator.current = (NodeBase *)0x0;
      local_78 = uVar13;
      iter.super_Iterator.list =
           (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)local_68;
      do {
        bVar7 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                EditingIterator::Next((EditingIterator *)local_68);
        if (!bVar7) break;
        pTVar10 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)local_68);
        if ((iter2.list !=
             (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
           ((undefined1  [8])iter2.list != local_40)) {
          while (iVar1 = pTVar10->value,
                pTVar11 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                          Iterator::Data((Iterator *)local_40), iVar1 < pTVar11->value) {
            pTVar11 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                      EditingIterator::InsertNodeBefore
                                ((EditingIterator *)local_68,*(ArenaAllocator **)this);
            pTVar12 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                      Iterator::Data((Iterator *)local_40);
            pTVar11->value = pTVar12->value;
            JITTypeHolderBase<void>::JITTypeHolderBase(&local_98,(JITType *)0x0);
            pTVar12 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                      Iterator::Data((Iterator *)local_40);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_98.t;
            OVar15 = (*fn)((ObjTypeGuardBucket)(auVar6 << 0x40),pTVar12->element);
            pTVar11->element = OVar15;
            if (iter2.list ==
                (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pNVar9 = iter.last;
              *(undefined4 *)&(iter.last)->next = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar7) goto LAB_003f25b8;
              *(undefined4 *)&pNVar9->next = 0;
            }
            pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                     ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *
                         )0x0;
            if ((undefined1  [8])pSVar2 != local_40) {
              iter2.list = pSVar2;
            }
            if ((iter2.list ==
                 (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
               ((undefined1  [8])iter2.list == local_40)) break;
          }
        }
        bVar7 = iter2.list !=
                (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0;
        bVar14 = (undefined1  [8])iter2.list != local_40;
        if (!bVar14 || !bVar7) break;
        iVar1 = pTVar10->value;
        pTVar11 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)local_40);
        if (iVar1 == pTVar11->value) {
          local_80 = (pTVar10->element).guardedPropertyOps;
          JVar3.t = (pTVar10->element).monoGuardType.t;
          pTVar11 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)local_40);
          OVar15.monoGuardType.t = JVar3.t;
          OVar15.guardedPropertyOps = local_80;
          OVar15 = (*fn)(OVar15,pTVar11->element);
          pTVar10->element = OVar15;
          if (iter2.list ==
              (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pNVar9 = iter.last;
            *(undefined4 *)&(iter.last)->next = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar8) goto LAB_003f25b8;
            *(undefined4 *)&pNVar9->next = 0;
          }
          pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
          if ((undefined1  [8])pSVar2 != local_40) {
            iter2.list = pSVar2;
          }
        }
      } while (bVar14 && bVar7);
      pNVar9 = iter.last;
      if ((iter2.list !=
           (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
         ((undefined1  [8])iter2.list != local_40)) {
        do {
          pTVar10 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                    EditingIterator::InsertNodeBefore
                              ((EditingIterator *)local_68,*(ArenaAllocator **)this);
          pTVar11 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)local_40);
          pTVar10->value = pTVar11->value;
          JITTypeHolderBase<void>::JITTypeHolderBase(&local_88,(JITType *)0x0);
          local_90 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
          pTVar11 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)local_40);
          OVar5.monoGuardType.t = local_88.t;
          OVar5.guardedPropertyOps = local_90;
          OVar15 = (*fn)(OVar5,pTVar11->element);
          pTVar10->element = OVar15;
          if (iter2.list ==
              (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pNVar9->next = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar7) goto LAB_003f25b8;
            *(undefined4 *)&pNVar9->next = 0;
          }
          pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
          if ((undefined1  [8])pSVar2 != local_40) {
            iter2.list = pSVar2;
          }
        } while ((iter2.list !=
                  (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0)
                && ((undefined1  [8])iter2.list != local_40));
      }
      uVar13 = local_78 + 1;
    } while (uVar13 < *(uint *)(this + 8));
  }
  return;
}

Assistant:

void Or(HashTable<T> * this2, Fn fn)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<Bucket<T>>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                    newBucket->value = iter2.Data().value;
                    newBucket->element = fn(nullptr, iter2.Data().element);
                    iter2.Next();
                }

                if (!iter2.IsValid())
                {
                    break;
                }
                if (bucket.value == iter2.Data().value)
                {
                    bucket.element = fn(bucket.element, iter2.Data().element);
                    iter2.Next();
                }
            } NEXT_SLISTBASE_ENTRY_EDITING;

            while (iter2.IsValid())
            {
                Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                newBucket->value = iter2.Data().value;
                newBucket->element = fn(nullptr, iter2.Data().element);
                iter2.Next();
            }
        }
    }